

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O1

void __thiscall i2p_tests::unlimited_recv::test_method(unlimited_recv *this)

{
  DNSLookupFn dns_lookup_function;
  string message;
  string message_00;
  MatchFn match;
  MatchFn match_00;
  _Manager_type p_Var1;
  bool bVar2;
  _func_unique_ptr<Sock,_std::default_delete<Sock>_>__Any_data_ptr_int_ptr_int_ptr_int_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data *p_Var3;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  bool proxy_error;
  Connection conn;
  DebugLogHelper debugloghelper20;
  DebugLogHelper debugloghelper19;
  Session session;
  Proxy sam_proxy;
  optional<CService> addr;
  CThreadInterrupt interrupt;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  check_type cVar4;
  _Manager_type in_stack_fffffffffffffb68;
  _Invoker_type in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  _func_int **in_stack_fffffffffffffb88;
  bool in_stack_fffffffffffffb90;
  undefined7 in_stack_fffffffffffffb91;
  assertion_result local_458;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  bool local_419;
  undefined8 local_418;
  undefined8 uStack_410;
  code *local_408;
  code *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d0;
  code *local_3c0;
  direct_or_indirect local_3b0;
  uint local_3a0;
  Connection local_388;
  long *local_330 [2];
  long local_320 [2];
  DebugLogHelper local_310;
  long *local_2c0 [2];
  long local_2b0 [2];
  DebugLogHelper local_2a0;
  path local_250;
  _Any_data local_228;
  _Manager_type local_218;
  _Invoker_type local_210;
  direct_or_indirect local_108;
  uint local_f8;
  undefined8 local_f0;
  uint16_t local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined2 local_c0;
  _Storage<CService,_false> local_b8;
  char local_90;
  CThreadInterrupt local_88;
  long local_28;
  
  p_Var1 = CreateSock.super__Function_base._M_manager;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_228._M_unused._M_object = CreateSock.super__Function_base._M_functor._M_unused._M_object;
  local_228._8_4_ = CreateSock.super__Function_base._M_functor._8_4_;
  local_228._12_4_ = CreateSock.super__Function_base._M_functor._12_4_;
  CreateSock.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CreateSock.super__Function_base._M_functor._8_8_ = 0;
  local_218 = CreateSock.super__Function_base._M_manager;
  CreateSock.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:49:18)>
       ::_M_manager;
  local_210 = CreateSock._M_invoker;
  CreateSock._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Sock,_std::default_delete<Sock>_>_(int,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp:49:18)>
       ::_M_invoke;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_228,&local_228,__destroy_functor);
  }
  CThreadInterrupt::CThreadInterrupt(&local_88);
  local_228._M_unused._M_object = &local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"127.0.0.1","");
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_3d0,&g_dns_lookup_abi_cxx11_);
  p_Var3 = &local_3d0;
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffffb5c;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffffb58;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar4;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffffb68;
  dns_lookup_function._M_invoker = in_stack_fffffffffffffb70;
  Lookup((optional<CService> *)&local_b8._M_value,(string *)&local_228,9000,false,
         dns_lookup_function);
  if (local_3c0 != (code *)0x0) {
    (*local_3c0)(&local_3d0,&local_3d0,__destroy_functor);
  }
  if ((_Manager_type *)local_228._M_unused._0_8_ != &local_218) {
    operator_delete(local_228._M_unused._M_object,(ulong)(local_218 + 1));
  }
  if (local_90 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_108.indirect_contents,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8._M_value);
    local_f0 = local_b8._24_8_;
    local_e8 = local_b8._M_value.port;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_c0 = 0;
    local_e0 = &local_d0;
    ArgsManager::GetDataDir((path *)&local_250,&gArgs,true);
    std::filesystem::__cxx11::path::_M_append(&local_250,0x14,"test_i2p_private_key");
    std::filesystem::__cxx11::path::path((path *)&local_388,&local_250);
    i2p::sam::Session::Session
              ((Session *)&local_228,(path *)&local_388,(Proxy *)&local_108.indirect_contents,
               &local_88);
    std::filesystem::__cxx11::path::~path((path *)&local_388);
    std::filesystem::__cxx11::path::~path(&local_250);
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"Creating persistent SAM session","");
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_3e0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_3e8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb5c;
    message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb58;
    message._M_string_length = (size_type)_cVar4;
    message.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb68;
    message.field_2._8_8_ = in_stack_fffffffffffffb70;
    match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb80;
    match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffb78;
    match.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb88;
    match._M_invoker._0_1_ = in_stack_fffffffffffffb90;
    match._M_invoker._1_7_ = in_stack_fffffffffffffb91;
    DebugLogHelper::DebugLogHelper(&local_2a0,message,match);
    if (local_3e8 != (code *)0x0) {
      (*local_3e8)(&local_3f8,&local_3f8,3);
    }
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_330,"too many bytes without a terminator","");
    local_418 = 0;
    uStack_410 = 0;
    local_400 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_408 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffb5c;
    message_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffb58;
    message_00._M_string_length = (size_type)_cVar4;
    message_00.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb68;
    message_00.field_2._8_8_ = in_stack_fffffffffffffb70;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb80;
    match_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffb78
    ;
    match_00.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb88;
    match_00._M_invoker._0_1_ = in_stack_fffffffffffffb90;
    match_00._M_invoker._1_7_ = in_stack_fffffffffffffb91;
    DebugLogHelper::DebugLogHelper(&local_310,message_00,match_00);
    if (local_408 != (code *)0x0) {
      (*local_408)(&local_418,&local_418,3);
    }
    if (local_330[0] != local_320) {
      operator_delete(local_330[0],local_320[0] + 1);
    }
    local_388.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
    super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
    _M_head_impl = (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
                   (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0;
    CService::CService(&local_388.me);
    CService::CService(&local_388.peer);
    local_430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/i2p_tests.cpp"
    ;
    local_428 = "";
    local_440 = &boost::unit_test::basic_cstring<char_const>::null;
    local_438 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x40;
    file.m_begin = (iterator)&local_430;
    msg.m_end = in_R9;
    msg.m_begin = (iterator)p_Var3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_440,msg);
    CService::CService((CService *)&local_3b0.indirect_contents);
    bVar2 = i2p::sam::Session::Connect
                      ((Session *)&local_228,(CService *)&local_3b0.indirect_contents,&local_388,
                       &local_419);
    local_458.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)!bVar2;
    local_458.m_message.px = (element_type *)0x0;
    local_458.m_message.pn.pi_ = (sp_counted_base *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_458,(lazy_ostream *)&stack0xfffffffffffffb88,2,0,WARN,_cVar4,
               (size_t)&stack0xfffffffffffffb68,0x40);
    boost::detail::shared_count::~shared_count(&local_458.m_message.pn);
    if (0x10 < local_3a0) {
      free(local_3b0.indirect_contents.indirect);
      local_3b0.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_388.peer.super_CNetAddr.m_addr._size) {
      free(local_388.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      local_388.peer.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x10 < local_388.me.super_CNetAddr.m_addr._size) {
      free(local_388.me.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      local_388.me.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
    }
    if (local_388.sock._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
        super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
        super__Head_base<0UL,_Sock_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<Sock,_std::default_delete<Sock>_>)0x0) {
      (**(code **)(*(long *)local_388.sock._M_t.
                            super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                            super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                            super__Head_base<0UL,_Sock_*,_false>._M_head_impl + 8))();
    }
    DebugLogHelper::~DebugLogHelper(&local_310);
    DebugLogHelper::~DebugLogHelper(&local_2a0);
    i2p::sam::Session::~Session((Session *)&local_228);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,
                                        local_d0._M_local_buf[0]) + 1);
    }
    if (0x10 < local_f8) {
      free(local_108.indirect_contents.indirect);
      local_108.indirect_contents.indirect = (char *)0x0;
    }
    if ((local_90 == '\x01') &&
       (local_90 = '\0', 0x10 < local_b8._M_value.super_CNetAddr.m_addr._size)) {
      free((void *)local_b8._0_8_);
      local_b8._0_8_ = (void *)0x0;
    }
    std::condition_variable::~condition_variable(&local_88.cond);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(unlimited_recv)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>(std::string(i2p::sam::MAX_MSG_SIZE + 1, 'a'));
    };

    CThreadInterrupt interrupt;
    const std::optional<CService> addr{Lookup("127.0.0.1", 9000, false)};
    const Proxy sam_proxy(addr.value(), false);
    i2p::sam::Session session(gArgs.GetDataDirNet() / "test_i2p_private_key", sam_proxy, &interrupt);

    {
        ASSERT_DEBUG_LOG("Creating persistent SAM session");
        ASSERT_DEBUG_LOG("too many bytes without a terminator");

        i2p::Connection conn;
        bool proxy_error;
        BOOST_REQUIRE(!session.Connect(CService{}, conn, proxy_error));
    }
}